

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O3

void __thiscall
FPalette::MakeRemap(FPalette *this,DWORD *colors,BYTE *remap,BYTE *useful,int numcolors)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int color;
  ulong uVar6;
  BYTE BVar7;
  ulong uVar8;
  int iVar9;
  PalEntry *pal;
  uint uVar10;
  int iVar11;
  RemappingWork workspace [511];
  uint uStack_1030;
  undefined1 auStack_102c [4];
  uint local_1028;
  char local_1024 [2036];
  uint uStack_830;
  char acStack_82c [2044];
  
  lVar2 = 1;
  do {
    (&uStack_1030)[lVar2 * 2] = this->BaseColors[lVar2].field_0.d & 0xffffff;
    auStack_102c[lVar2 * 8] = 0;
    auStack_102c[lVar2 * 8 + 1] = (char)lVar2;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  if (numcolors < 1) {
    iVar5 = 0;
    uVar10 = 0xff;
  }
  else {
    uVar10 = 0xff;
    uVar4 = 0;
    iVar5 = 0;
    do {
      if ((useful == (BYTE *)0x0) || (useful[uVar4] != '\0')) {
        lVar2 = (long)(int)uVar10;
        *(DWORD *)(local_1024 + lVar2 * 8 + -4) = colors[uVar4] & 0xffffff;
        local_1024[lVar2 * 8] = '\x01';
        local_1024[lVar2 * 8 + 1] = (char)uVar4;
        uVar10 = uVar10 + 1;
        iVar5 = iVar5 + 1;
      }
      else {
        remap[uVar4] = '\0';
      }
      uVar4 = uVar4 + 1;
    } while ((uint)numcolors != uVar4);
  }
  _uStack_1030 = 0x4927d4;
  qsort(&local_1028,(long)(int)uVar10,8,sortforremap2);
  if (1 < (int)uVar10) {
    iVar3 = 0;
    do {
      lVar2 = (long)iVar3;
      if (((local_1024[lVar2 * 8] != '\0') && (local_1024[lVar2 * 8 + 8] == '\0')) &&
         (*(int *)(local_1024 + lVar2 * 8 + -4) == *(int *)(local_1024 + (lVar2 + 1) * 8 + -4))) {
        iVar3 = iVar3 + 1;
        remap[(byte)local_1024[lVar2 * 8 + 1]] = local_1024[(lVar2 + 1) * 8 + 1];
        local_1024[lVar2 * 8] = '\x02';
        iVar5 = iVar5 + -1;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < (int)(uVar10 - 1));
  }
  if (0 < (int)uVar10 && 0 < iVar5) {
    uVar4 = 0;
    do {
      if (local_1024[uVar4 * 8] == '\x01') {
        uVar1 = *(uint *)(local_1024 + uVar4 * 8 + -4);
        iVar5 = 0x30603;
        uVar8 = 1;
        uVar6 = 1;
        do {
          iVar11 = (uVar1 >> 0x10 & 0xff) - (uint)this->BaseColors[uVar6].field_0.field_0.r;
          iVar9 = (uVar1 >> 8 & 0xff) - (uint)this->BaseColors[uVar6].field_0.field_0.g;
          iVar3 = (uVar1 & 0xff) - (uint)this->BaseColors[uVar6].field_0.field_0.b;
          iVar3 = iVar3 * iVar3 + iVar9 * iVar9 + iVar11 * iVar11;
          if (iVar3 < iVar5) {
            if (iVar3 == 0) {
              BVar7 = (BYTE)uVar6;
              break;
            }
            uVar8 = uVar6 & 0xffffffff;
            iVar5 = iVar3;
          }
          BVar7 = (BYTE)uVar8;
          uVar6 = uVar6 + 1;
        } while ((int)uVar6 != 0xff);
        remap[(byte)local_1024[uVar4 * 8 + 1]] = BVar7;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar10);
  }
  return;
}

Assistant:

void FPalette::MakeRemap (const DWORD *colors, BYTE *remap, const BYTE *useful, int numcolors) const
{
	RemappingWork workspace[255+256];
	int i, j, k;

	// Fill in workspace with the colors from the passed palette and this palette.
	// By sorting this array, we can quickly find exact matches so that we can
	// minimize the time spent calling BestColor for near matches.

	for (i = 1; i < 256; ++i)
	{
		workspace[i-1].Color = DWORD(BaseColors[i]) & 0xFFFFFF;
		workspace[i-1].Foreign = 0;
		workspace[i-1].PalEntry = i;
	}
	for (i = k = 0, j = 255; i < numcolors; ++i)
	{
		if (useful == NULL || useful[i] != 0)
		{
			workspace[j].Color = colors[i] & 0xFFFFFF;
			workspace[j].Foreign = 1;
			workspace[j].PalEntry = i;
			++j;
			++k;
		}
		else
		{
			remap[i] = 0;
		}
	}
	qsort (workspace, j, sizeof(RemappingWork), sortforremap2);

	// Find exact matches
	--j;
	for (i = 0; i < j; ++i)
	{
		if (workspace[i].Foreign)
		{
			if (!workspace[i+1].Foreign && workspace[i].Color == workspace[i+1].Color)
			{
				remap[workspace[i].PalEntry] = workspace[i+1].PalEntry;
				workspace[i].Foreign = 2;
				++i;
				--k;
			}
		}
	}

	// Find near matches
	if (k > 0)
	{
		for (i = 0; i <= j; ++i)
		{
			if (workspace[i].Foreign == 1)
			{
				remap[workspace[i].PalEntry] = BestColor ((DWORD *)BaseColors,
					RPART(workspace[i].Color), GPART(workspace[i].Color), BPART(workspace[i].Color),
					1, 255);
			}
		}
	}
}